

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O2

char * lookup_gname_helper(name_cache *cache,id_t id)

{
  archive *a;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t __buflen;
  group *result;
  group grent;
  group *local_50;
  group local_48;
  
  __buflen = cache->buff_size;
  if (__buflen == 0) {
    cache->buff_size = 0x100;
    __buflen = 0x100;
    pcVar2 = (char *)malloc(0x100);
    cache->buff = pcVar2;
  }
  else {
    pcVar2 = cache->buff;
  }
  if (pcVar2 != (char *)0x0) {
    while (local_50 = &local_48, iVar1 = getgrgid_r(id,&local_48,pcVar2,__buflen,&local_50),
          iVar1 == 0x22) {
      __buflen = cache->buff_size * 2;
      pcVar2 = (char *)realloc(cache->buff,__buflen);
      if (pcVar2 == (char *)0x0) goto LAB_0033ff9e;
      cache->buff = pcVar2;
      cache->buff_size = __buflen;
    }
    if (iVar1 != 0) {
LAB_0033ff9e:
      a = cache->archive;
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Can\'t lookup group for id %d",id);
      return (char *)0x0;
    }
    if (local_50 != (group *)0x0) {
      pcVar2 = strdup(local_50->gr_name);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *
lookup_gname_helper(struct name_cache *cache, id_t id)
{
	struct group	grent, *result;
	char * nbuff;
	size_t nbuff_size;
	int r;

	if (cache->buff_size == 0) {
		cache->buff_size = 256;
		cache->buff = malloc(cache->buff_size);
	}
	if (cache->buff == NULL)
		return (NULL);
	for (;;) {
		result = &grent; /* Old getgrgid_r ignores last arg. */
		r = getgrgid_r((gid_t)id, &grent,
			       cache->buff, cache->buff_size, &result);
		if (r == 0)
			break;
		if (r != ERANGE)
			break;
		/* ERANGE means our buffer was too small, but POSIX
		 * doesn't tell us how big the buffer should be, so
		 * we just double it and try again. */
		nbuff_size = cache->buff_size * 2;
		nbuff = realloc(cache->buff, nbuff_size);
		if (nbuff == NULL)
			break;
		cache->buff = nbuff;
		cache->buff_size = nbuff_size;
	}
	if (r != 0) {
		archive_set_error(cache->archive, errno,
		    "Can't lookup group for id %d", (int)id);
		return (NULL);
	}
	if (result == NULL)
		return (NULL);

	return strdup(result->gr_name);
}